

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

double __thiscall Tokenizer::readInteger(Tokenizer *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  char local_39;
  undefined1 local_38 [6];
  bool decimal;
  char c;
  string str;
  double doubleStr;
  Tokenizer *this_local;
  
  str.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = false;
  while( true ) {
    iVar2 = std::istream::peek();
    if ((iVar2 != 0x2e) || (bVar3 = true, bVar1)) {
      iVar2 = std::istream::peek();
      iVar2 = isdigit(iVar2);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    std::istream::get((char *)this->inStream);
    if (local_39 == '.') {
      bVar1 = true;
    }
    std::__cxx11::string::operator+=((string *)local_38,local_39);
  }
  dVar4 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
  str.field_2._8_8_ = dVar4;
  std::__cxx11::string::~string((string *)local_38);
  return dVar4;
}

Assistant:

double Tokenizer::readInteger() {
    // This function is called when it is known that
    // the first character in input is a digit.
    // The function reads and returns all remaining digits.

    double doubleStr = 0;
    std::string str;
    char c;
    bool decimal = false;
    while( ((inStream.peek() == '.') && !decimal) || isdigit(inStream.peek())) {
        inStream.get(c);
        if(c == '.')
            decimal = true;
        str += c;
    }
    doubleStr = std::stod(str);
    return doubleStr;
}